

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.cpp
# Opt level: O0

bool roll_em(MonsterThing *thatt,MonsterThing *thdef,ItemThing *weap,bool hurl)

{
  int iVar1;
  int sides;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  int local_68;
  int local_64;
  int proll;
  int damage;
  int dplus;
  int hplus;
  bool did_hit;
  int def_arm;
  int nsides;
  int ndice;
  char *cp;
  stats *def;
  stats *att;
  bool hurl_local;
  ItemThing *weap_local;
  MonsterThing *thdef_local;
  MonsterThing *thatt_local;
  
  dplus._3_1_ = false;
  if (weap == (ItemThing *)0x0) {
    _nsides = (thatt->stats).s_dmg;
    proll = 0;
    damage = 0;
  }
  else {
    if (weap == (ItemThing *)0x0) {
      local_64 = 0;
    }
    else {
      local_64 = weap->hplus;
    }
    damage = local_64;
    if (weap == (ItemThing *)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = weap->dplus;
    }
    proll = local_68;
    if (weap == cur_weapon) {
      if ((cur_ring[0] == (ItemThing *)0x0) || (cur_ring[0]->which != 8)) {
        if ((cur_ring[0] != (ItemThing *)0x0) && (cur_ring[0]->which == 7)) {
          damage = cur_ring[0]->arm + local_64;
        }
      }
      else {
        proll = cur_ring[0]->arm + local_68;
      }
      if ((cur_ring[1] == (ItemThing *)0x0) || (cur_ring[1]->which != 8)) {
        if ((cur_ring[1] != (ItemThing *)0x0) && (cur_ring[1]->which == 7)) {
          damage = cur_ring[1]->arm + damage;
        }
      }
      else {
        proll = cur_ring[1]->arm + proll;
      }
    }
    _nsides = weap->damage;
    if (hurl) {
      if ((((weap->flags & 4U) == 0) || (cur_weapon == (ItemThing *)0x0)) ||
         (cur_weapon->which != weap->launch)) {
        if (weap->launch < 0) {
          _nsides = weap->hurldmg;
        }
      }
      else {
        _nsides = weap->hurldmg;
        damage = cur_weapon->hplus + damage;
        proll = cur_weapon->dplus + proll;
      }
    }
  }
  if ((thdef->flags & 0x2000U) == 0) {
    damage = damage + 4;
  }
  hplus = (thdef->stats).s_arm;
  if (thdef == &player) {
    if (cur_armor != (ItemThing *)0x0) {
      hplus = cur_armor->arm;
    }
    if ((cur_ring[0] != (ItemThing *)0x0) && (cur_ring[0]->which == 0)) {
      hplus = hplus - cur_ring[0]->arm;
    }
    if ((cur_ring[1] != (ItemThing *)0x0) && (cur_ring[1]->which == 0)) {
      hplus = hplus - cur_ring[1]->arm;
    }
  }
  while( true ) {
    bVar4 = false;
    if (_nsides != (char *)0x0) {
      bVar4 = *_nsides != '\0';
    }
    if (!bVar4) {
      return dplus._3_1_;
    }
    iVar1 = atoi(_nsides);
    pcVar3 = strchr(_nsides,0x78);
    if (pcVar3 == (char *)0x0) {
      return dplus._3_1_;
    }
    sides = atoi(pcVar3 + 1);
    iVar2 = swing((thatt->stats).s_lvl,hplus,damage + str_plus[(thatt->stats).s_str]);
    if (iVar2 != 0) {
      iVar1 = roll(iVar1,sides);
      iVar1 = max<int>(0,proll + iVar1 + add_dam[(thatt->stats).s_str]);
      (thdef->stats).s_hpt = (thdef->stats).s_hpt - iVar1;
      dplus._3_1_ = true;
    }
    _nsides = strchr(pcVar3 + 1,0x2f);
    if (_nsides == (char *)0x0) break;
    _nsides = _nsides + 1;
  }
  return dplus._3_1_;
}

Assistant:

bool roll_em(MonsterThing *thatt, MonsterThing *thdef, ItemThing *weap, bool hurl)
{
    register struct stats *att, *def;
    register char *cp;
    register int ndice, nsides, def_arm;
    register bool did_hit = false;
    register int hplus;
    register int dplus;
    register int damage;

    att = &thatt->stats;
    def = &thdef->stats;
    if (weap == nullptr)
    {
        cp = att->s_dmg;
        dplus = 0;
        hplus = 0;
    }
    else
    {
        hplus = (weap == nullptr ? 0 : weap->hplus);
        dplus = (weap == nullptr ? 0 : weap->dplus);
        if (weap == cur_weapon)
        {
            if (ISRING(LEFT, R_ADDDAM))
                dplus += cur_ring[LEFT]->arm;
            else if (ISRING(LEFT, R_ADDHIT))
                hplus += cur_ring[LEFT]->arm;
            if (ISRING(RIGHT, R_ADDDAM))
                dplus += cur_ring[RIGHT]->arm;
            else if (ISRING(RIGHT, R_ADDHIT))
                hplus += cur_ring[RIGHT]->arm;
        }
        cp = weap->damage;
        if (hurl)
        {
            if ((weap->flags&ISMISL) && cur_weapon != nullptr && cur_weapon->which == weap->launch)
            {
                cp = weap->hurldmg;
                hplus += cur_weapon->hplus;
                dplus += cur_weapon->dplus;
            }
            else if (weap->launch < 0)
                cp = weap->hurldmg;
        }
    }
    /*
     * If the creature being attacked is not running (alseep or held)
     * then the attacker gets a plus four bonus to hit.
     */
    if (!on(*thdef, ISRUN))
        hplus += 4;
    def_arm = def->s_arm;
    if (def == &player.stats)
    {
        if (cur_armor != nullptr)
            def_arm = cur_armor->arm;
        if (ISRING(LEFT, R_PROTECT))
            def_arm -= cur_ring[LEFT]->arm;
        if (ISRING(RIGHT, R_PROTECT))
            def_arm -= cur_ring[RIGHT]->arm;
    }
    while(cp != nullptr && *cp != '\0')
    {
        ndice = atoi(cp);
        if ((cp = strchr(cp, 'x')) == nullptr)
            break;
        nsides = atoi(++cp);
        if (swing(att->s_lvl, def_arm, hplus + str_plus[att->s_str]))
        {
            int proll;

            proll = roll(ndice, nsides);
            damage = dplus + proll + add_dam[att->s_str];
            def->s_hpt -= max(0, damage);
            did_hit = true;
        }
        if ((cp = strchr(cp, '/')) == nullptr)
            break;
        cp++;
    }
    return did_hit;
}